

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O2

void __thiscall
level_aux_mesh::build(level_aux_mesh *this,xr_level_som *som,xr_gamemtls_lib *gamemtls_lib)

{
  float fVar1;
  level_aux_mesh *this_00;
  bool bVar2;
  __normal_iterator<xray_re::xr_gamemtl_**,_std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>_>
  _Var3;
  fvector3 *right;
  long lVar4;
  uint32_t face_idx;
  undefined8 local_140;
  xr_level_som *local_138;
  level_aux_mesh *local_130;
  b_face_vec *local_128;
  xr_gamemtl_vec gamemtls;
  vector<unsigned_int,_std::allocator<unsigned_int>_> refs;
  b_face face_template;
  xr_gamemtl pattern;
  
  std::vector<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::vector
            (&gamemtls,&gamemtls_lib->m_materials);
  std::
  __sort<__gnu_cxx::__normal_iterator<xray_re::xr_gamemtl**,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>,__gnu_cxx::__ops::_Iter_comp_iter<sound_occ_pred>>
            (gamemtls.
             super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
             _M_impl.super__Vector_impl_data._M_start,
             gamemtls.
             super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pattern.name._M_dataplus._M_p = (pointer)&pattern.name.field_2;
  pattern.name._M_string_length = 0;
  pattern.name.field_2._M_local_buf[0] = '\0';
  pattern.desc._M_dataplus._M_p = (pointer)&pattern.desc.field_2;
  pattern.desc._M_string_length = 0;
  pattern.desc.field_2._M_local_buf[0] = '\0';
  face_idx = 0;
  refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&refs,(ulong)(som->m_num_polys * 3));
  local_128 = &(this->super_xr_mesh_builder).m_faces;
  std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
  reserve(local_128,(ulong)som->m_num_polys);
  xray_re::xr_mesh_builder::b_face::b_face(&face_template);
  right = &(som->m_polys->field_0).field_0.v2;
  lVar4 = (ulong)som->m_num_polys * 0x2c;
  local_138 = som;
  local_130 = this;
  do {
    this_00 = local_130;
    if (lVar4 == 0) {
      if (face_idx != 0) {
        compact_vertices<xray_re::som_poly>(local_130,&refs,local_138->m_polys);
        create_uvs(this_00);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      xray_re::xr_gamemtl::~xr_gamemtl(&pattern);
      std::_Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>::
      ~_Vector_base(&gamemtls.
                     super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                   );
      return;
    }
    bVar2 = xray_re::_vector3<float>::operator==((_vector3<float> *)(right + -2),right + -1);
    if (!bVar2) {
      bVar2 = xray_re::_vector3<float>::operator==((_vector3<float> *)(right + -2),right);
      if (!bVar2) {
        bVar2 = xray_re::_vector3<float>::operator==(right + -1,right);
        if (!bVar2) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&refs,&face_idx);
          local_140 = (xr_gamemtl *)(CONCAT44(local_140._4_4_,face_idx) | 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&refs,(uint *)&local_140);
          local_140 = (xr_gamemtl *)(CONCAT44(local_140._4_4_,face_idx) | 2);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&refs,(uint *)&local_140);
          face_idx = face_idx + 4;
          pattern.snd_occlusion_factor = *(float *)((long)(right + 1) + 4);
          local_140 = &pattern;
          _Var3 = std::
                  __lower_bound<__gnu_cxx::__normal_iterator<xray_re::xr_gamemtl**,std::vector<xray_re::xr_gamemtl*,std::allocator<xray_re::xr_gamemtl*>>>,xray_re::xr_gamemtl*,__gnu_cxx::__ops::_Iter_comp_val<sound_occ_pred>>
                            (gamemtls.
                             super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             gamemtls.
                             super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_140);
          if (_Var3._M_current ==
              gamemtls.
              super__Vector_base<xray_re::xr_gamemtl_*,_std::allocator<xray_re::xr_gamemtl_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_001219a6:
            __assert_fail("gamemtl_it != gamemtls.end() && (*gamemtl_it)->snd_occlusion_factor == it->occ"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_aux_mesh.cxx"
                          ,0x62,
                          "void level_aux_mesh::build(const xr_level_som &, const xr_gamemtls_lib &)"
                         );
          }
          fVar1 = (*_Var3._M_current)->snd_occlusion_factor;
          if ((fVar1 != *(float *)((long)(right + 1) + 4)) ||
             (NAN(fVar1) || NAN(*(float *)((long)(right + 1) + 4)))) goto LAB_001219a6;
          face_template.field_1.field_1.sgroup._0_2_ = (undefined2)(*_Var3._M_current)->id;
          face_template.field_1.field_1.surf_idx = 0;
          face_template.field_1.field_1.sgroup._2_2_ = (ushort)(*(int *)(right + 1) != 0) << 3;
          std::
          vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
          ::push_back(local_128,&face_template);
        }
      }
    }
    right = (fvector3 *)((long)(right + 3) + 8);
    lVar4 = lVar4 + -0x2c;
  } while( true );
}

Assistant:

void level_aux_mesh::build(const xr_level_som& som, const xr_gamemtls_lib& gamemtls_lib)
{
	xr_gamemtl_vec gamemtls(gamemtls_lib.materials());
	std::sort(gamemtls.begin(), gamemtls.end(), sound_occ_pred());

	xr_gamemtl pattern;

	uint32_t face_idx = 0;

	std::vector<uint32_t> refs;
	refs.reserve(3*som.num_polys());
	m_faces.reserve(som.num_polys());
	b_face face_template;
	for (const som_poly *it = som.polys(), *end = it + som.num_polys(); it != end; ++it) {
		if (it->v0 == it->v1 || it->v0 == it->v2 || it->v1 == it->v2)
			continue;
		refs.push_back(face_idx);
		refs.push_back(face_idx | 1);
		refs.push_back(face_idx | 2);
		face_idx += 4;
		pattern.snd_occlusion_factor = it->occ;
		xr_gamemtl_vec_cit gamemtl_it = std::lower_bound(gamemtls.begin(), gamemtls.end(),
				&pattern, sound_occ_pred());
		xr_assert(gamemtl_it != gamemtls.end() && (*gamemtl_it)->snd_occlusion_factor == it->occ);
		face_template.surface.set(0, 0, (*gamemtl_it)->id, it->b2sided ? RSF_TWO_SIDED : 0);
		m_faces.push_back(face_template);
	}
	if (face_idx) {
		compact_vertices(refs, som.polys());
		create_uvs();
	}
}